

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::CorrectGraphicsPipelineDesc
               (GraphicsPipelineDesc *GraphicsPipeline,DeviceFeatures *Features)

{
  ulong local_20;
  size_t rt;
  DeviceFeatures *Features_local;
  GraphicsPipelineDesc *GraphicsPipeline_local;
  
  for (local_20 = (ulong)GraphicsPipeline->NumRenderTargets; local_20 < 8; local_20 = local_20 + 1)
  {
    GraphicsPipeline->RTVFormats[local_20] = TEX_FORMAT_UNKNOWN;
  }
  anon_unknown_61::CorrectBlendStateDesc(GraphicsPipeline);
  anon_unknown_61::CorrectRasterizerStateDesc(GraphicsPipeline,Features);
  anon_unknown_61::CorrectDepthStencilDesc(GraphicsPipeline);
  return;
}

Assistant:

void CorrectGraphicsPipelineDesc(GraphicsPipelineDesc& GraphicsPipeline, const DeviceFeatures& Features) noexcept
{
    for (size_t rt = GraphicsPipeline.NumRenderTargets; rt < _countof(GraphicsPipeline.RTVFormats); ++rt)
        GraphicsPipeline.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;

    CorrectBlendStateDesc(GraphicsPipeline);
    CorrectRasterizerStateDesc(GraphicsPipeline, Features);
    CorrectDepthStencilDesc(GraphicsPipeline);
}